

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double units::puconversion::assumedBase(unit *start,unit *result)

{
  bool bVar1;
  bool local_31;
  unit local_30;
  unit local_28;
  unit *local_20;
  unit *result_local;
  unit *start_local;
  
  local_20 = result;
  result_local = start;
  bVar1 = unit::operator==((unit *)&puHz,result);
  if ((bVar1) || (bVar1 = unit::operator==((unit *)&puHz,result_local), bVar1)) {
    return 60.0;
  }
  bVar1 = unit::operator==((unit *)&puMW,local_20);
  if ((!bVar1) && (bVar1 = unit::operator==((unit *)&puMW,result_local), !bVar1)) {
    local_28 = unit_cast((precise_unit *)precise::special::mach);
    bVar1 = unit::operator==(&local_28,local_20);
    local_31 = true;
    if (!bVar1) {
      local_30 = unit_cast((precise_unit *)precise::special::mach);
      local_31 = unit::operator==(&local_30,result_local);
    }
    if (local_31 == false) {
      return NAN;
    }
    return 341.25;
  }
  return 100.0;
}

Assistant:

inline double assumedBase(const unit& start, const unit& result)
    {
        if (puHz == result || puHz == start) {  // assume 60 Hz
            return 60.0;
        }
        if (puMW == result || puMW == start) {  // assume 100MVA for power base
            return 100.0;
        }
        // mach number
        if (unit_cast(precise::special::mach) == result ||
            unit_cast(precise::special::mach) ==
                start) {  // assume NASA mach number approximation conversions
            return 341.25;
        }
        return constants::invalid_conversion;
    }